

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O0

void __thiscall
duckdb::StreamQueryResult::StreamQueryResult(StreamQueryResult *this,ErrorData *error)

{
  ErrorData *in_RDI;
  ErrorData *in_stack_00000040;
  QueryResultType in_stack_0000004f;
  QueryResult *in_stack_00000050;
  ErrorData *in_stack_ffffffffffffff48;
  
  ErrorData::ErrorData(in_RDI,in_stack_ffffffffffffff48);
  QueryResult::QueryResult(in_stack_00000050,in_stack_0000004f,in_stack_00000040);
  ErrorData::~ErrorData(in_RDI);
  *(undefined ***)in_RDI = &PTR__StreamQueryResult_0350cc10;
  shared_ptr<duckdb::ClientContext,_true>::shared_ptr
            ((shared_ptr<duckdb::ClientContext,_true> *)0x8a2126);
  shared_ptr<duckdb::BufferedData,_true>::shared_ptr
            ((shared_ptr<duckdb::BufferedData,_true> *)0x8a2139);
  return;
}

Assistant:

StreamQueryResult::StreamQueryResult(ErrorData error) : QueryResult(QueryResultType::STREAM_RESULT, std::move(error)) {
}